

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_sub_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  void *__src;
  void *__s;
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  sexp psVar4;
  sexp_sint_t sVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  ulong uVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  sexp c;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_58;
  size_t local_50;
  sexp_gc_var_t local_48;
  
  __src = (void *)((long)&a->value + 0x10);
  puVar7 = (undefined1 *)((long)&((a->value).type.cpl)->tag + 2);
  do {
    puVar10 = puVar7;
    if (puVar10 == (undefined1 *)0x3) {
      puVar10 = (undefined1 *)0x1;
      goto LAB_00119d56;
    }
    puVar7 = puVar10 + -1;
  } while (*(long *)(&a->tag + (long)puVar10 * 2) == 0);
  puVar10 = puVar10 + -2;
LAB_00119d56:
  puVar7 = (undefined1 *)((long)&((b->value).type.cpl)->tag + 2);
  do {
    puVar11 = puVar7;
    if (puVar11 == (undefined1 *)0x3) {
      puVar11 = (undefined1 *)0x1;
      goto LAB_00119d7c;
    }
    puVar7 = puVar11 + -1;
  } while (*(long *)(&b->tag + (long)puVar11 * 2) == 0);
  puVar11 = puVar11 + -2;
LAB_00119d7c:
  local_58 = (sexp_conflict)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if ((puVar10 < puVar11) ||
     ((puVar10 == puVar11 && (sVar5 = sexp_bignum_compare_abs(a,b), sVar5 < 0)))) {
    psVar4 = sexp_bignum_sub_digits(ctx,dst,b,a);
    return psVar4;
  }
  local_48.var = &local_58;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  if (dst != (sexp)0x0) {
    puVar7 = (undefined1 *)((long)&((dst->value).type.cpl)->tag + 2);
    do {
      puVar6 = puVar7;
      if (puVar6 == (undefined1 *)0x3) {
        puVar6 = (undefined1 *)0x1;
        goto LAB_00119e14;
      }
      puVar7 = puVar6 + -1;
    } while (*(long *)(&dst->tag + (long)puVar6 * 2) == 0);
    puVar6 = puVar6 + -2;
LAB_00119e14:
    if (puVar10 <= puVar6) goto LAB_00119e92;
  }
  uVar8 = (a->value).string.offset;
  local_50 = uVar8 * 8;
  dst = sexp_alloc_tagged_aux(ctx,uVar8 * 8 + 0x18,0xc);
  (dst->value).string.offset = uVar8;
  uVar2 = (a->value).string.offset;
  if (uVar2 < uVar8) {
    uVar8 = uVar2;
  }
  (dst->value).flonum_bits[0] = (a->value).flonum_bits[0];
  __s = (void *)((long)&dst->value + 0x10);
  memset(__s,0,local_50);
  memmove(__s,__src,uVar8 << 3);
LAB_00119e92:
  if (puVar11 == (undefined1 *)0x0) {
    puVar7 = (undefined1 *)0x0;
    bVar3 = false;
  }
  else {
    lVar9 = 0;
    puVar7 = (undefined1 *)0x0;
    do {
      uVar8 = *(ulong *)((long)__src + (long)puVar7 * 8);
      uVar2 = *(ulong *)((long)&b->value + (long)puVar7 * 8 + 0x10);
      if ((uVar2 < uVar8) || ((lVar9 == 0 && (uVar8 == uVar2)))) {
        *(ulong *)((long)&dst->value + (long)puVar7 * 8 + 0x10) = uVar8 - (lVar9 + uVar2);
        bVar3 = false;
        lVar9 = 0;
      }
      else {
        *(ulong *)((long)&dst->value + (long)puVar7 * 8 + 0x10) = -(uVar2 + lVar9);
        *(ulong *)((long)&dst->value + (long)puVar7 * 8 + 0x10) =
             *(long *)((long)__src + (long)puVar7 * 8) - (uVar2 + lVar9);
        lVar9 = 1;
        bVar3 = true;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 < puVar11);
  }
  if (bVar3) {
    do {
      if (puVar10 <= puVar7) break;
      plVar1 = (long *)((long)&dst->value + (long)puVar7 * 8 + 0x10);
      lVar9 = *plVar1;
      *plVar1 = *plVar1 + -1;
      puVar7 = puVar7 + 1;
    } while (lVar9 == 0);
  }
  (ctx->value).context.saves = local_48.next;
  return dst;
}

Assistant:

sexp sexp_bignum_sub_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    borrow=0, i, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if ((alen < blen) || ((alen == blen) && (sexp_bignum_compare_abs(a, b) < 0)))
    return sexp_bignum_sub_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    if (adata[i] > bdata[i] || (adata[i] == bdata[i] && !borrow)) {
      cdata[i] = adata[i] - bdata[i] - borrow;
      borrow = 0;
    } else {
      cdata[i] = (SEXP_UINT_T_MAX - bdata[i]);
      cdata[i] += 1;
      cdata[i] -= borrow;
      cdata[i] += adata[i];
      borrow = 1;
    }
  }
  for ( ; borrow && (i<alen); i++) {
    borrow = (cdata[i] == 0 ? 1 : 0);
    cdata[i]--;
  }
  sexp_gc_release1(ctx);
  return c;
}